

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

ClientHook * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::ensureAccepted
          (DeferredThirdPartyClient *this)

{
  uint uVar1;
  RpcConnectionState *vine;
  PointerReader *pPVar2;
  PointerReader contact;
  Own<capnp::ClientHook,_std::nullptr_t> *pOVar3;
  ClientHook *pCVar4;
  undefined1 local_48 [16];
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> local_38;
  SegmentReader *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  uVar1 = (this->state).tag;
  if (uVar1 == 2) {
    pCVar4 = *(ClientHook **)((long)&(this->state).field_1 + 8);
  }
  else {
    if (uVar1 != 1) {
      kj::_::unreachable();
    }
    vine = (this->super_RpcClient).connectionState.ptr;
    pPVar2 = *(PointerReader **)((long)&(this->state).field_1 + 8);
    local_28 = pPVar2->segment;
    uStack_20 = pPVar2->capTable;
    local_18 = pPVar2->pointer;
    uStack_10 = *(undefined8 *)&pPVar2->nestingLimit;
    contact = *pPVar2;
    local_38.disposer = *(Disposer **)((long)&(this->state).field_1 + 0x10);
    local_38.ptr = *(RpcClient **)((long)&(this->state).field_1 + 0x18);
    *(undefined8 *)((long)&(this->state).field_1 + 0x18) = 0;
    acceptThirdParty((RpcConnectionState *)local_48,(Reader)contact,
                     (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
                     vine,SUB81(&local_38,0));
    pOVar3 = kj::
             OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,kj::Own<capnp::ClientHook,decltype(nullptr)>>
             ::
             init<kj::Own<capnp::ClientHook,decltype(nullptr)>,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                       ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                         *)&this->state,(Own<capnp::ClientHook,_std::nullptr_t> *)local_48);
    pCVar4 = pOVar3->ptr;
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)local_48);
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::dispose
              (&local_38);
  }
  return pCVar4;
}

Assistant:

ClientHook& ensureAccepted() {
      // Call when this capability is actually used locally. If it's the first use, the Accept
      // message will be sent to actually accept it.

      KJ_SWITCH_ONEOF(state) {
        KJ_CASE_ONEOF(deferred, Deferred) {
          return *state.init<kj::Own<ClientHook>>(
              connectionState->acceptThirdParty(
                  *deferred.contact, kj::mv(deferred.vine), needEmbargo));
        }
        KJ_CASE_ONEOF(cap, kj::Own<ClientHook>) {
          return *cap;
        }
      }
      KJ_UNREACHABLE;
    }